

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O0

void __thiscall
irr::gui::CGUISpriteBank::draw2DSprite
          (CGUISpriteBank *this,u32 index,rect<int> *destRect,rect<int> *clip,SColor *colors,
          u32 timeTicks,bool loop)

{
  uint uVar1;
  bool bVar2;
  u32 uVar3;
  SGUISpriteFrame *pSVar4;
  long lVar5;
  rect<int> *prVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  undefined8 in_R8;
  u32 rn;
  ITexture *tex;
  u32 frame;
  u32 in_stack_ffffffffffffff8c;
  array<irr::gui::SGUISprite> *in_stack_ffffffffffffff90;
  array<irr::core::rect<int>_> *this_00;
  u32 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  u32 *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  
  bVar2 = getFrameNr((CGUISpriteBank *)(ulong)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                     SUB81((ulong)in_RDI >> 0x38,0));
  if (bVar2) {
    core::array<irr::gui::SGUISprite>::operator[]
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    pSVar4 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                       ((array<irr::gui::SGUISpriteFrame> *)in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff8c);
    lVar5 = (**(code **)(*in_RDI + 0x18))(in_RDI,pSVar4->textureNumber);
    if (lVar5 != 0) {
      core::array<irr::gui::SGUISprite>::operator[]
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      pSVar4 = core::array<irr::gui::SGUISpriteFrame>::operator[]
                         ((array<irr::gui::SGUISpriteFrame> *)in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff8c);
      uVar1 = pSVar4->rectNumber;
      uVar3 = core::array<irr::core::rect<int>_>::size((array<irr::core::rect<int>_> *)0x3d44ed);
      if (uVar1 < uVar3) {
        this_00 = (array<irr::core::rect<int>_> *)in_RDI[0xe];
        prVar6 = core::array<irr::core::rect<int>_>::operator[](this_00,in_stack_ffffffffffffff8c);
        (*(code *)(this_00->m_data).
                  super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start[0x19].UpperLeftCorner)
                  (this_00,lVar5,in_RDX,prVar6,in_RCX,in_R8,1);
      }
    }
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSprite(u32 index, const core::rect<s32> &destRect,
		const core::rect<s32> *clip, const video::SColor *const colors,
		u32 timeTicks, bool loop)
{
	u32 frame = 0;
	if (!getFrameNr(frame, index, timeTicks, loop))
		return;

	const video::ITexture *tex = getTexture(Sprites[index].Frames[frame].textureNumber);
	if (!tex)
		return;

	const u32 rn = Sprites[index].Frames[frame].rectNumber;
	if (rn >= Rectangles.size())
		return;

	Driver->draw2DImage(tex, destRect, Rectangles[rn], clip, colors, true);
}